

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedJoint.cpp
# Opt level: O0

Transform * __thiscall
iDynTree::FixedJoint::getTransform
          (FixedJoint *this,VectorDynSize *jntPos,LinkIndex child,LinkIndex parent)

{
  LinkIndex parent_local;
  LinkIndex child_local;
  VectorDynSize *jntPos_local;
  FixedJoint *this_local;
  Transform *local_8;
  
  if (child == this->link1) {
    local_8 = &this->link1_X_link2;
  }
  else {
    local_8 = &this->link2_X_link1;
  }
  return local_8;
}

Assistant:

const Transform & FixedJoint::getTransform(const VectorDynSize & jntPos, const LinkIndex child, const LinkIndex parent) const
{
    if( child == this->link1 )
    {
        return this->link1_X_link2;
    }
    else
    {
        assert(child == this->link2);
        assert(parent == this->link1);
        return this->link2_X_link1;
    }
}